

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

Token * __thiscall wabt::WastLexer::GetReservedToken(Token *__return_storage_ptr__,WastLexer *this)

{
  ReadReservedChars(this);
  TextToken(__return_storage_ptr__,this,Reserved,0);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetReservedToken() {
  ReadReservedChars();
  return TextToken(TokenType::Reserved);
}